

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_Jinx::Variant_&,_const_int_&> * __thiscall
Catch::ExprLhs<Jinx::Variant_const&>::operator<
          (BinaryExpr<const_Jinx::Variant_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<Jinx::Variant_const&> *this,int *rhs)

{
  Variant *pVVar1;
  bool bVar2;
  Variant VStack_68;
  StringRef local_40;
  
  pVVar1 = *(Variant **)this;
  Jinx::Variant::Variant(&VStack_68,*rhs);
  bVar2 = Jinx::operator<(pVVar1,&VStack_68);
  pVVar1 = *(Variant **)this;
  StringRef::StringRef(&local_40,"<");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0024ac38;
  __return_storage_ptr__->m_lhs = pVVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  Jinx::Variant::Destroy(&VStack_68);
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }